

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

int KINSol(void *kinmem,N_Vector u,int strategy_in,N_Vector u_scale,N_Vector f_scale)

{
  uint uVar1;
  N_Vector p_Var2;
  KINMem in_RCX;
  int in_EDX;
  N_Vector in_RSI;
  KINMem in_RDI;
  N_Vector in_R8;
  int maxStepTaken;
  int sflag;
  int ret;
  KINMem kin_mem;
  sunrealtype epsmin;
  sunrealtype f1normp;
  sunrealtype fnormp;
  int *in_stack_00000090;
  sunrealtype *in_stack_00000098;
  sunrealtype *in_stack_000000a0;
  KINMem in_stack_000000a8;
  KINMem in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  uint uVar4;
  KINMem kin_mem_00;
  KINMem kin_mem_01;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_4;
  
  uVar3 = 0;
  kin_mem_01 = (KINMem)&DAT_bff0000000000000;
  kin_mem_00 = (KINMem)0x0;
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x1fb,"KINSol",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = 0xffffffff;
  }
  else if (in_RDI->kin_MallocDone == 0) {
    KINProcessError(in_RDI,-3,0x204,"KINSol",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                    ,"Attempt to call before KINMalloc illegal.");
    local_4 = 0xfffffffd;
  }
  else {
    in_RDI->kin_uu = in_RSI;
    in_RDI->kin_uscale = (N_Vector)in_RCX;
    in_RDI->kin_fscale = in_R8;
    in_RDI->kin_globalstrategy = in_EDX;
    if (in_RDI->kin_globalstrategy == 3) {
      if (in_RDI->kin_uu == (N_Vector)0x0) {
        KINProcessError(in_RDI,-2,0x218,"KINSol",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                        ,"uu = NULL illegal.");
        local_4 = 0xfffffffe;
      }
      else if (in_RDI->kin_constraintsSet == 0) {
        KINPrintInfo((KINMem)in_RDI->kin_scsteptol,(int)in_RDI->kin_fnormtol,(char *)in_RDI,
                     (char *)0x3,"KINSOL","KINSol","scsteptol = %12.3lg, fnormtol = %12.3lg");
        in_RDI->kin_nbktrk = 0;
        in_RDI->kin_nbcf = 0;
        in_RDI->kin_nni = 0;
        in_RDI->kin_nnilset_sub = 0;
        in_RDI->kin_nnilset = 0;
        in_RDI->kin_nfe = 0;
        local_4 = KINFP(in_RDI);
        if (local_4 == 0xfffffff3) {
          KINProcessError(in_RDI,-0xd,0x232,"KINSol",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                          ,"The system function failed in an unrecoverable manner.");
        }
        else if (local_4 == 0xfffffffa) {
          KINProcessError(in_RDI,-6,0x236,"KINSol",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                          ,"The maximum number of iterations was reached before convergence.");
        }
      }
      else {
        KINProcessError(in_RDI,-2,0x220,"KINSol",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                        ,"Constraints not allowed with fixed point or Picard iterations");
        local_4 = 0xfffffffe;
      }
    }
    else {
      local_4 = KINSolInit(in_stack_ffffffffffffff98);
      if (local_4 == 0) {
        in_RDI->kin_ncscmx = 0;
        if (in_RDI->kin_noInitSetup == 0) {
          in_RDI->kin_sthrsh = 2.0;
        }
        else {
          in_RDI->kin_sthrsh = 1.0;
        }
        if ((in_RDI->kin_inexact_ls != 0) && (in_RDI->kin_noMinEps == 0)) {
          kin_mem_00 = (KINMem)(in_RDI->kin_fnormtol * 0.01);
        }
        if ((in_RDI->kin_omega != 0.0) || (NAN(in_RDI->kin_omega))) {
          in_RDI->kin_eval_omega = 0;
        }
        else {
          in_RDI->kin_eval_omega = 1;
        }
        if (in_RDI->kin_globalstrategy == 2) {
          if (in_RDI->kin_gval == (N_Vector)0x0) {
            p_Var2 = (N_Vector)N_VClone(in_RDI->kin_unew);
            in_RDI->kin_gval = p_Var2;
            if (in_RDI->kin_gval == (N_Vector)0x0) {
              KINProcessError(in_RDI,-4,0x268,"KINSol",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                              ,"A memory request failed.");
              return -4;
            }
            in_RDI->kin_liw = in_RDI->kin_liw1 + in_RDI->kin_liw;
            in_RDI->kin_lrw = in_RDI->kin_lrw1 + in_RDI->kin_lrw;
          }
          local_4 = KINPicardAA(kin_mem_01);
        }
        else {
          do {
            in_RDI->kin_retry_nni = 0;
            in_RDI->kin_nni = in_RDI->kin_nni + 1;
            if ((in_RDI->kin_inexact_ls != 0) &&
               (in_RDI->kin_eps = (in_RDI->kin_eta + in_RDI->kin_uround) * in_RDI->kin_fnorm,
               in_RDI->kin_noMinEps == 0)) {
              in_stack_ffffffffffffff98 = kin_mem_00;
              if ((double)kin_mem_00 < in_RDI->kin_eps || (double)kin_mem_00 == in_RDI->kin_eps) {
                in_stack_ffffffffffffff98 = (KINMem)in_RDI->kin_eps;
              }
              in_RDI->kin_eps = (sunrealtype)in_stack_ffffffffffffff98;
            }
            while( true ) {
              uVar4 = 0;
              if (in_RDI->kin_globalstrategy == 0) {
                uVar1 = KINLinSolDrv(in_stack_ffffffffffffff98);
                local_4 = uVar1;
                if (((uVar1 != 0) ||
                    (local_4 = KINFullNewton(kin_mem_00,(sunrealtype *)in_RDI,
                                             (sunrealtype *)(ulong)uVar4,
                                             (int *)CONCAT44(uVar3,in_stack_ffffffffffffffa0)),
                    local_4 == 0xfffffff3)) || (local_4 == 0xfffffff1)) goto LAB_0010b502;
              }
              else {
                uVar1 = local_4;
                if (in_RDI->kin_globalstrategy == 1) {
                  uVar1 = KINLinSolDrv(in_stack_ffffffffffffff98);
                  local_4 = uVar1;
                  if (((uVar1 != 0) ||
                      (local_4 = KINLineSearch(in_stack_000000a8,in_stack_000000a0,in_stack_00000098
                                               ,in_stack_00000090), local_4 == 0xfffffff3)) ||
                     (local_4 == 0xfffffff1)) goto LAB_0010b502;
                  if (in_RDI->kin_mxnbcf < in_RDI->kin_nbcf) {
                    local_4 = 0xfffffff8;
                    goto LAB_0010b502;
                  }
                }
              }
              local_4 = uVar1;
              if ((in_RDI->kin_globalstrategy == 2) || (in_RDI->kin_globalstrategy == 3)) break;
              if (in_RDI->kin_callForcingTerm != 0) {
                KINForcingTerm((KINMem)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                               (sunrealtype)in_RCX);
              }
              in_RDI->kin_fnorm = (sunrealtype)&DAT_bff0000000000000;
              local_4 = KINStop(in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8);
              if (local_4 != 0xfffffc1a) break;
              in_RDI->kin_retry_nni = 1;
            }
            N_VScale(0x3ff0000000000000,in_RDI->kin_unew,in_RDI->kin_uu);
            in_RDI->kin_f1norm = (sunrealtype)kin_mem_01;
            KINPrintInfo((KINMem)in_RDI->kin_fnorm,(int)in_RDI,(char *)0x2,"KINSOL","KINSol",
                         "nni = %4ld, nfe = %6ld, fnorm = %26.16lg",in_RDI->kin_nni,in_RDI->kin_nfe)
            ;
          } while (local_4 == 0xfffffc19);
LAB_0010b502:
          KINPrintInfo(in_RDI,1,"KINSOL","KINSol","Return value: %d",(ulong)local_4);
          switch(local_4) {
          case 0xfffffff1:
            KINProcessError(in_RDI,-0xf,0x2e6,"KINSol",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                            ,"Unable to correct repeated recoverable system function errors.");
            break;
          case 0xfffffff3:
            KINProcessError(in_RDI,-0xd,0x2e2,"KINSol",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                            ,"The system function failed in an unrecoverable manner.");
            break;
          case 0xfffffff4:
            KINProcessError(in_RDI,-0xc,0x2ee,"KINSol",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                            ,
                            "The linear solver\'s solve function failed in an unrecoverable manner."
                           );
            break;
          case 0xfffffff5:
            KINProcessError(in_RDI,-0xb,0x2ea,"KINSol",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                            ,
                            "The linear solver\'s setup function failed in an unrecoverable manner."
                           );
            break;
          case 0xfffffff7:
            KINProcessError(in_RDI,-9,0x2f2,"KINSol",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                            ,
                            "The linear solver\'s solve function failed recoverably, but the Jacobian data is already current."
                           );
            break;
          case 0xfffffff8:
            KINProcessError(in_RDI,-8,0x2fa,"KINSol",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                            ,
                            "The line search algorithm was unable to satisfy the beta-condition for nbcfails iterations."
                           );
            break;
          case 0xfffffff9:
            KINProcessError(in_RDI,-7,0x302,"KINSol",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                            ,
                            "Five consecutive steps have been taken that satisfy a scaled step length test."
                           );
            break;
          case 0xfffffffa:
            KINProcessError(in_RDI,-6,0x2fe,"KINSol",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                            ,"The maximum number of iterations was reached before convergence.");
            break;
          case 0xfffffffb:
            KINProcessError(in_RDI,-5,0x2f6,"KINSol",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                            ,
                            "The line search algorithm was unable to find an iterate sufficiently distinct from the current iterate."
                           );
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int KINSol(void* kinmem, N_Vector u, int strategy_in, N_Vector u_scale,
           N_Vector f_scale)
{
  sunrealtype fnormp, f1normp, epsmin;
  KINMem kin_mem;
  int ret, sflag;
  sunbooleantype maxStepTaken;

  /* initialize to avoid compiler warning messages */

  maxStepTaken = SUNFALSE;
  f1normp = fnormp = -ONE;

  /* initialize epsmin to avoid compiler warning message */

  epsmin = ZERO;

  /* check for kinmem non-NULL */

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  SUNDIALS_MARK_FUNCTION_BEGIN(KIN_PROFILER);

  if (kin_mem->kin_MallocDone == SUNFALSE)
  {
    KINProcessError(kin_mem, KIN_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_NO_MALLOC);
  }

  /* load input arguments */

  kin_mem->kin_uu             = u;
  kin_mem->kin_uscale         = u_scale;
  kin_mem->kin_fscale         = f_scale;
  kin_mem->kin_globalstrategy = strategy_in;

  /* CSW:
     Call fixed point solver if requested.  Note that this should probably
     be forked off to a FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_FP)
  {
    if (kin_mem->kin_uu == NULL)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_UU_NULL);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

    if (kin_mem->kin_constraintsSet != SUNFALSE)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_CONSTRAINTS_NOTOK);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_TOL, "KINSOL", __func__, INFO_TOL,
                 kin_mem->kin_scsteptol, kin_mem->kin_fnormtol);
#endif

    kin_mem->kin_nfe = kin_mem->kin_nnilset = kin_mem->kin_nnilset_sub =
      kin_mem->kin_nni = kin_mem->kin_nbcf = kin_mem->kin_nbktrk = 0;
    ret = KINFP(kin_mem);

    switch (ret)
    {
    case KIN_SYSFUNC_FAIL:
      KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_SYSFUNC_FAILED);
      break;
    case KIN_MAXITER_REACHED:
      KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__,
                      __FILE__, MSG_MAXITER_REACHED);
      break;
    }

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  /* initialize solver */
  ret = KINSolInit(kin_mem);
  if (ret != KIN_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  kin_mem->kin_ncscmx = 0;

  /* Note: The following logic allows the choice of whether or not
     to force a call to the linear solver setup upon a given call to
     KINSol */

  if (kin_mem->kin_noInitSetup) { kin_mem->kin_sthrsh = ONE; }
  else { kin_mem->kin_sthrsh = TWO; }

  /* if eps is to be bounded from below, set the bound */

  if (kin_mem->kin_inexact_ls && !(kin_mem->kin_noMinEps))
  {
    epsmin = POINT01 * kin_mem->kin_fnormtol;
  }

  /* if omega is zero at this point, make sure it will be evaluated
     at each iteration based on the provided min/max bounds and the
     current function norm. */
  if (kin_mem->kin_omega == ZERO) { kin_mem->kin_eval_omega = SUNTRUE; }
  else { kin_mem->kin_eval_omega = SUNFALSE; }

  /* CSW:
     Call fixed point solver for Picard method if requested.
     Note that this should probably be forked off to a part of an
     FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_PICARD)
  {
    if (kin_mem->kin_gval == NULL)
    {
      kin_mem->kin_gval = N_VClone(kin_mem->kin_unew);
      if (kin_mem->kin_gval == NULL)
      {
        KINProcessError(kin_mem, KIN_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_MEM_FAIL);
        SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
        return (KIN_MEM_FAIL);
      }
      kin_mem->kin_liw += kin_mem->kin_liw1;
      kin_mem->kin_lrw += kin_mem->kin_lrw1;
    }
    ret = KINPicardAA(kin_mem);

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  for (;;)
  {
    kin_mem->kin_retry_nni = SUNFALSE;

    kin_mem->kin_nni++;

    /* calculate the epsilon (stopping criteria for iterative linear solver)
       for this iteration based on eta from the routine KINForcingTerm */

    if (kin_mem->kin_inexact_ls)
    {
      kin_mem->kin_eps = (kin_mem->kin_eta + kin_mem->kin_uround) *
                         kin_mem->kin_fnorm;
      if (!(kin_mem->kin_noMinEps))
      {
        kin_mem->kin_eps = SUNMAX(epsmin, kin_mem->kin_eps);
      }
    }

  repeat_nni:

    /* call the appropriate routine to calculate an acceptable step pp */

    sflag = 0;

    if (kin_mem->kin_globalstrategy == KIN_NONE)
    {
      /* Full Newton Step*/

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINFullNewton(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }
    }
    else if (kin_mem->kin_globalstrategy == KIN_LINESEARCH)
    {
      /* Line Search */

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINLineSearch(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }

      /* if too many beta condition failures, then stop iteration */
      if (kin_mem->kin_nbcf > kin_mem->kin_mxnbcf)
      {
        ret = KIN_LINESEARCH_BCFAIL;
        break;
      }
    }

    if ((kin_mem->kin_globalstrategy != KIN_PICARD) &&
        (kin_mem->kin_globalstrategy != KIN_FP))
    {
      /* evaluate eta by calling the forcing term routine */
      if (kin_mem->kin_callForcingTerm) { KINForcingTerm(kin_mem, fnormp); }

      kin_mem->kin_fnorm = fnormp;

      /* call KINStop to check if tolerances where met by this iteration */
      ret = KINStop(kin_mem, maxStepTaken, sflag);

      if (ret == RETRY_ITERATION)
      {
        kin_mem->kin_retry_nni = SUNTRUE;
        goto repeat_nni;
      }
    }

    /* update uu after the iteration */
    N_VScale(ONE, kin_mem->kin_unew, kin_mem->kin_uu);

    kin_mem->kin_f1norm = f1normp;

    /* print the current nni, fnorm, and nfe values */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_NNI, "KINSOL", __func__, INFO_NNI,
                 kin_mem->kin_nni, kin_mem->kin_nfe, kin_mem->kin_fnorm);
#endif

    if (ret != CONTINUE_ITERATIONS) { break; }

  } /* end of loop; return */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
  KINPrintInfo(kin_mem, PRNT_RETVAL, "KINSOL", __func__, INFO_RETVAL, ret);
#endif

  switch (ret)
  {
  case KIN_SYSFUNC_FAIL:
    KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_SYSFUNC_FAILED);
    break;
  case KIN_REPTD_SYSFUNC_ERR:
    KINProcessError(kin_mem, KIN_REPTD_SYSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_SYSFUNC_REPTD);
    break;
  case KIN_LSETUP_FAIL:
    KINProcessError(kin_mem, KIN_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSETUP_FAILED);
    break;
  case KIN_LSOLVE_FAIL:
    KINProcessError(kin_mem, KIN_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSOLVE_FAILED);
    break;
  case KIN_LINSOLV_NO_RECOVERY:
    KINProcessError(kin_mem, KIN_LINSOLV_NO_RECOVERY, __LINE__, __func__,
                    __FILE__, MSG_LINSOLV_NO_RECOVERY);
    break;
  case KIN_LINESEARCH_NONCONV:
    KINProcessError(kin_mem, KIN_LINESEARCH_NONCONV, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_NONCONV);
    break;
  case KIN_LINESEARCH_BCFAIL:
    KINProcessError(kin_mem, KIN_LINESEARCH_BCFAIL, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_BCFAIL);
    break;
  case KIN_MAXITER_REACHED:
    KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__, __FILE__,
                    MSG_MAXITER_REACHED);
    break;
  case KIN_MXNEWT_5X_EXCEEDED:
    KINProcessError(kin_mem, KIN_MXNEWT_5X_EXCEEDED, __LINE__, __func__,
                    __FILE__, MSG_MXNEWT_5X_EXCEEDED);
    break;
  }

  SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
  return (ret);
}